

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filterednormalizer2.cpp
# Opt level: O1

UnicodeString * __thiscall
icu_63::FilteredNormalizer2::normalizeSecondAndAppend
          (FilteredNormalizer2 *this,UnicodeString *first,UnicodeString *second,UBool doNormalize,
          UErrorCode *errorCode)

{
  ushort uVar1;
  short sVar2;
  uint uVar3;
  uint uVar4;
  int32_t iVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  UnicodeString *pUVar8;
  char16_t *pcVar9;
  UnicodeString prefix;
  UnicodeString middle;
  UnicodeString local_b0;
  UnicodeString local_70;
  
  if ((*errorCode < U_ILLEGAL_ARGUMENT_ERROR) &&
     ((undefined1  [56])((undefined1  [56])first->fUnion & (undefined1  [56])0x1) !=
      (undefined1  [56])0x0)) {
    *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
  }
  if ((*errorCode < U_ILLEGAL_ARGUMENT_ERROR) &&
     ((undefined1  [56])((undefined1  [56])second->fUnion & (undefined1  [56])0x1) !=
      (undefined1  [56])0x0)) {
    *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
  }
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if (first == second) {
      *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      if ((ushort)(first->fUnion).fStackFields.fLengthAndFlags < 0x20) {
        if (doNormalize == '\0') {
          pUVar8 = UnicodeString::operator=(first,second);
          return pUVar8;
        }
        iVar6 = (*(this->super_Normalizer2).super_UObject._vptr_UObject[3])
                          (this,second,first,errorCode);
        return (UnicodeString *)CONCAT44(extraout_var,iVar6);
      }
      uVar1 = (second->fUnion).fStackFields.fLengthAndFlags;
      if ((uVar1 & 0x11) == 0) {
        if ((uVar1 & 2) == 0) {
          pcVar9 = (second->fUnion).fFields.fArray;
        }
        else {
          pcVar9 = (char16_t *)((long)&second->fUnion + 2);
        }
      }
      else {
        pcVar9 = (char16_t *)0x0;
      }
      uVar3 = (int)(short)uVar1 >> 5;
      if ((short)uVar1 < 0) {
        uVar3 = (second->fUnion).fFields.fLength;
      }
      uVar4 = (int)uVar3 >> 0x1f & uVar3;
      iVar5 = UnicodeSet::span(this->set,pcVar9 + (int)uVar4,uVar3 - uVar4,USET_SPAN_SIMPLE);
      iVar6 = iVar5 + uVar4;
      if (iVar6 != 0) {
        UnicodeString::tempSubString(&local_b0,second,0,iVar6);
        uVar1 = (first->fUnion).fStackFields.fLengthAndFlags;
        if ((uVar1 & 0x11) == 0) {
          if ((uVar1 & 2) == 0) {
            pcVar9 = (first->fUnion).fFields.fArray;
          }
          else {
            pcVar9 = (first->fUnion).fStackFields.fBuffer;
          }
        }
        else {
          pcVar9 = (char16_t *)0x0;
        }
        iVar5 = (int)(short)uVar1 >> 5;
        if ((short)uVar1 < 0) {
          iVar5 = (first->fUnion).fFields.fLength;
        }
        iVar5 = UnicodeSet::spanBack(this->set,pcVar9,iVar5,USET_SPAN_SIMPLE);
        if (iVar5 == 0) {
          (*(this->norm2->super_UObject)._vptr_UObject[(ulong)(doNormalize == '\0') + 5])
                    (this->norm2,first,&local_b0,errorCode);
        }
        else {
          UnicodeString::UnicodeString(&local_70,first,iVar5,0x7fffffff);
          (*(this->norm2->super_UObject)._vptr_UObject[(ulong)(doNormalize == '\0') + 5])
                    (this->norm2,&local_70,&local_b0,errorCode);
          if (-1 < local_70.fUnion.fStackFields.fLengthAndFlags) {
            local_70.fUnion.fFields.fLength = (int)local_70.fUnion.fStackFields.fLengthAndFlags >> 5
            ;
          }
          UnicodeString::doReplace
                    (first,iVar5,0x7fffffff,&local_70,0,local_70.fUnion.fFields.fLength);
          UnicodeString::~UnicodeString(&local_70);
        }
        UnicodeString::~UnicodeString(&local_b0);
      }
      sVar2 = (second->fUnion).fStackFields.fLengthAndFlags;
      if (sVar2 < 0) {
        iVar7 = (second->fUnion).fFields.fLength;
      }
      else {
        iVar7 = (int)sVar2 >> 5;
      }
      if (iVar6 < iVar7) {
        UnicodeString::tempSubString(&local_b0,second,iVar6,0x7fffffff);
        if (doNormalize == '\0') {
          if (-1 < local_b0.fUnion.fStackFields.fLengthAndFlags) {
            local_b0.fUnion.fFields.fLength = (int)local_b0.fUnion.fStackFields.fLengthAndFlags >> 5
            ;
          }
          UnicodeString::doAppend(first,&local_b0,0,local_b0.fUnion.fFields.fLength);
        }
        else {
          normalize(this,&local_b0,first,USET_SPAN_NOT_CONTAINED,errorCode);
        }
        UnicodeString::~UnicodeString(&local_b0);
      }
    }
  }
  return first;
}

Assistant:

UnicodeString &
FilteredNormalizer2::normalizeSecondAndAppend(UnicodeString &first,
                                              const UnicodeString &second,
                                              UBool doNormalize,
                                              UErrorCode &errorCode) const {
    uprv_checkCanGetBuffer(first, errorCode);
    uprv_checkCanGetBuffer(second, errorCode);
    if(U_FAILURE(errorCode)) {
        return first;
    }
    if(&first==&second) {
        errorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return first;
    }
    if(first.isEmpty()) {
        if(doNormalize) {
            return normalize(second, first, errorCode);
        } else {
            return first=second;
        }
    }
    // merge the in-filter suffix of the first string with the in-filter prefix of the second
    int32_t prefixLimit=set.span(second, 0, USET_SPAN_SIMPLE);
    if(prefixLimit!=0) {
        UnicodeString prefix(second.tempSubString(0, prefixLimit));
        int32_t suffixStart=set.spanBack(first, INT32_MAX, USET_SPAN_SIMPLE);
        if(suffixStart==0) {
            if(doNormalize) {
                norm2.normalizeSecondAndAppend(first, prefix, errorCode);
            } else {
                norm2.append(first, prefix, errorCode);
            }
        } else {
            UnicodeString middle(first, suffixStart, INT32_MAX);
            if(doNormalize) {
                norm2.normalizeSecondAndAppend(middle, prefix, errorCode);
            } else {
                norm2.append(middle, prefix, errorCode);
            }
            first.replace(suffixStart, INT32_MAX, middle);
        }
    }
    if(prefixLimit<second.length()) {
        UnicodeString rest(second.tempSubString(prefixLimit, INT32_MAX));
        if(doNormalize) {
            normalize(rest, first, USET_SPAN_NOT_CONTAINED, errorCode);
        } else {
            first.append(rest);
        }
    }
    return first;
}